

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::Impl::applyStructSizeRequirement
          (Impl *this,RawSchema *raw,uint dataWordCount,uint pointerCount)

{
  Reader node_00;
  uint uVar1;
  ArrayPtr<capnp::word> AVar2;
  Reader node;
  Reader local_58;
  
  readMessageUnchecked<capnp::schema::Node>(&local_58,raw->encodedNode);
  uVar1 = 0;
  if (0x7f < local_58._reader.dataSize) {
    uVar1 = (uint)*(ushort *)((long)local_58._reader.data + 0xe);
  }
  if (dataWordCount <= uVar1) {
    uVar1 = 0;
    if (0xcf < local_58._reader.dataSize) {
      uVar1 = (uint)*(ushort *)((long)local_58._reader.data + 0x18);
    }
    if (pointerCount <= uVar1) {
      return;
    }
  }
  node_00._reader.pointerCount = local_58._reader.pointerCount;
  node_00._reader._38_2_ = local_58._reader._38_2_;
  node_00._reader.dataSize = local_58._reader.dataSize;
  node_00._reader.capTable = local_58._reader.capTable;
  node_00._reader.segment = local_58._reader.segment;
  node_00._reader.data = local_58._reader.data;
  node_00._reader.pointers = local_58._reader.pointers;
  node_00._reader.nestingLimit = local_58._reader.nestingLimit;
  node_00._reader._44_4_ = local_58._reader._44_4_;
  AVar2 = rewriteStructNodeWithSizes(this,node_00,dataWordCount,pointerCount);
  raw->encodedNode = AVar2.ptr;
  raw->encodedSize = (uint32_t)AVar2.size_;
  return;
}

Assistant:

void SchemaLoader::Impl::applyStructSizeRequirement(
    _::RawSchema* raw, uint dataWordCount, uint pointerCount) {
  auto node = readMessageUnchecked<schema::Node>(raw->encodedNode);

  auto structNode = node.getStruct();
  if (structNode.getDataWordCount() < dataWordCount ||
      structNode.getPointerCount() < pointerCount) {
    // Sizes need to be increased.  Must rewrite.
    kj::ArrayPtr<word> words = rewriteStructNodeWithSizes(node, dataWordCount, pointerCount);

    // We don't need to re-validate the node because we know this change could not possibly have
    // invalidated it.  Just remake the unchecked message.
    raw->encodedNode = words.begin();
    raw->encodedSize = words.size();
  }
}